

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void edition_unittest::Int64ParseTester::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  Int64ParseTester **v1;
  Int64ParseTester **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  RepeatedField<long> *pRVar3;
  RepeatedField<long> *pRVar4;
  uint32_t *puVar5;
  anon_union_208_1_493b367e_for_Int64ParseTester_9 *this;
  Int64ParseTester *extendee;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  Int64ParseTester *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Int64ParseTester *from;
  Int64ParseTester *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (Int64ParseTester *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (Int64ParseTester *)to_msg;
  _this = (Int64ParseTester *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::Int64ParseTester_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<edition_unittest::Int64ParseTester*>
                 (&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<edition_unittest::Int64ParseTester_const*,edition_unittest::Int64ParseTester*>
                       (v1,v2,"&from != _this");
  if (local_30 == (Nullable<const_char_*>)0x0) {
    pRVar3 = _internal_mutable_repeated_int64_lowfield(from);
    pRVar4 = _internal_repeated_int64_lowfield
                       ((Int64ParseTester *)absl_log_internal_check_op_result);
    google::protobuf::RepeatedField<long>::MergeFrom(pRVar3,pRVar4);
    pRVar3 = _internal_mutable_packed_int64_lowfield(from);
    pRVar4 = _internal_packed_int64_lowfield((Int64ParseTester *)absl_log_internal_check_op_result);
    google::protobuf::RepeatedField<long>::MergeFrom(pRVar3,pRVar4);
    pRVar3 = _internal_mutable_repeated_int64_midfield(from);
    pRVar4 = _internal_repeated_int64_midfield
                       ((Int64ParseTester *)absl_log_internal_check_op_result);
    google::protobuf::RepeatedField<long>::MergeFrom(pRVar3,pRVar4);
    pRVar3 = _internal_mutable_packed_int64_midfield(from);
    pRVar4 = _internal_packed_int64_midfield((Int64ParseTester *)absl_log_internal_check_op_result);
    google::protobuf::RepeatedField<long>::MergeFrom(pRVar3,pRVar4);
    pRVar3 = _internal_mutable_repeated_int64_hifield(from);
    pRVar4 = _internal_repeated_int64_hifield((Int64ParseTester *)absl_log_internal_check_op_result)
    ;
    google::protobuf::RepeatedField<long>::MergeFrom(pRVar3,pRVar4);
    pRVar3 = _internal_mutable_packed_int64_hifield(from);
    pRVar4 = _internal_packed_int64_hifield((Int64ParseTester *)absl_log_internal_check_op_result);
    google::protobuf::RepeatedField<long>::MergeFrom(pRVar3,pRVar4);
    puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x28),0);
    uVar1 = *puVar5;
    if ((uVar1 & 0xf) != 0) {
      if ((uVar1 & 1) != 0) {
        (from->field_0)._impl_.optional_int64_lowfield_ =
             *(int64_t *)(absl_log_internal_check_op_result + 0xc0);
      }
      if ((uVar1 & 2) != 0) {
        (from->field_0)._impl_.optional_int64_midfield_ =
             *(int64_t *)(absl_log_internal_check_op_result + 200);
      }
      if ((uVar1 & 4) != 0) {
        (from->field_0)._impl_.optional_int64_hifield_ =
             *(int64_t *)(absl_log_internal_check_op_result + 0xd0);
      }
      if ((uVar1 & 8) != 0) {
        (from->field_0)._impl_.other_field_ = *(int32_t *)(absl_log_internal_check_op_result + 0xd8)
        ;
      }
    }
    puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(from->field_0)._impl_._has_bits_,0);
    *puVar5 = uVar1 | *puVar5;
    this = &from->field_0;
    extendee = default_instance();
    google::protobuf::internal::ExtensionSet::MergeFrom
              (&(this->_impl_)._extensions_,(MessageLite *)extendee,
               (ExtensionSet *)(absl_log_internal_check_op_result + 0x10));
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
             ,0xd8f3,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

void Int64ParseTester::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Int64ParseTester*>(&to_msg);
  auto& from = static_cast<const Int64ParseTester&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.Int64ParseTester)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_int64_lowfield()->MergeFrom(from._internal_repeated_int64_lowfield());
  _this->_internal_mutable_packed_int64_lowfield()->MergeFrom(from._internal_packed_int64_lowfield());
  _this->_internal_mutable_repeated_int64_midfield()->MergeFrom(from._internal_repeated_int64_midfield());
  _this->_internal_mutable_packed_int64_midfield()->MergeFrom(from._internal_packed_int64_midfield());
  _this->_internal_mutable_repeated_int64_hifield()->MergeFrom(from._internal_repeated_int64_hifield());
  _this->_internal_mutable_packed_int64_hifield()->MergeFrom(from._internal_packed_int64_hifield());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.optional_int64_lowfield_ = from._impl_.optional_int64_lowfield_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.optional_int64_midfield_ = from._impl_.optional_int64_midfield_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.optional_int64_hifield_ = from._impl_.optional_int64_hifield_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.other_field_ = from._impl_.other_field_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}